

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O0

int icamax(int n,complex<float> *x,int incx)

{
  complex<float> z;
  complex<float> z_00;
  complex<float> z_01;
  complex<float> z_02;
  complex<float> z_03;
  complex<float> z_04;
  int iVar1;
  undefined4 in_register_0000003c;
  float fVar2;
  undefined4 local_2c;
  undefined4 local_28;
  int value;
  float smax;
  int ix;
  int i;
  int incx_local;
  complex<float> *x_local;
  int n_local;
  
  if ((n < 1) || (incx < 1)) {
    x_local._4_4_ = 0;
  }
  else {
    local_2c = 1;
    if (n == 1) {
      x_local._4_4_ = 1;
    }
    else {
      if (incx == 1) {
        z._M_value._4_4_ = in_register_0000003c;
        z._M_value._0_4_ = n;
        iVar1 = n;
        local_28 = cabs1(z);
        for (smax = 1.4013e-45; (int)smax < n; smax = (float)((int)smax + 1)) {
          z_00._M_value._4_4_ = in_register_0000003c;
          z_00._M_value._0_4_ = iVar1;
          fVar2 = cabs1(z_00);
          if (local_28 < fVar2) {
            local_2c = (int)smax + 1;
            z_01._M_value._4_4_ = in_register_0000003c;
            z_01._M_value._0_4_ = iVar1;
            local_28 = cabs1(z_01);
          }
        }
      }
      else {
        z_02._M_value._4_4_ = in_register_0000003c;
        z_02._M_value._0_4_ = n;
        iVar1 = n;
        local_28 = cabs1(z_02);
        for (smax = 1.4013e-45; (int)smax < n; smax = (float)((int)smax + 1)) {
          z_03._M_value._4_4_ = in_register_0000003c;
          z_03._M_value._0_4_ = iVar1;
          fVar2 = cabs1(z_03);
          if (local_28 < fVar2) {
            local_2c = (int)smax + 1;
            z_04._M_value._4_4_ = in_register_0000003c;
            z_04._M_value._0_4_ = iVar1;
            local_28 = cabs1(z_04);
          }
        }
      }
      x_local._4_4_ = local_2c;
    }
  }
  return x_local._4_4_;
}

Assistant:

int icamax ( int n, complex <float> x[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    ICAMAX indexes the vector element of maximum absolute value.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//    WARNING: This index is a 1-based index, not a 0-based index!
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for FORTRAN usage,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, pages 308-323, 1979.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, complex <float> X[], the vector.
//
//    Input, int INCX, the increment between successive entries of X.
//
//    Output, int ICAMAX, the index of the element of maximum
//    absolute value.
//
{
  int i;
  int ix;
  float smax;
  int value;

  value = 0;

  if ( n < 1 || incx  <=  0 )
  {
    return value;
  }

  value = 1;

  if ( n == 1 )
  {
    return value;
  }

  if ( incx != 1 )
  {
    ix = 0;
    smax = cabs1 ( x[0] );
    ix = ix + incx;

    for ( i = 1; i < n; i++ )
    {
      if ( smax < cabs1 ( x[ix] ) )
      {
        value = i + 1;
        smax = cabs1 ( x[ix] );
      }
      ix = ix + incx;
    }
  }
  else
  {
    smax = cabs1 ( x[0] );
    for ( i = 1; i < n; i++ )
    {
      if ( smax < cabs1 ( x[i] ) )
      {
        value = i + 1;
        smax = cabs1 ( x[i] );
      }
    }
  }

  return value;
}